

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::PackedInt32::_InternalSerialize
          (PackedInt32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  RepeatedField<int> *this_00;
  LogMessage *pLVar4;
  const_pointer piVar5;
  void *data;
  const_pointer piVar6;
  int byte_size;
  uint32_t cached_has_bits;
  PackedInt32 *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  PackedInt32 *this_local;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_b0;
  byte *local_88;
  ulong local_80;
  LogMessage local_58;
  Voidify local_41;
  byte *local_40;
  undefined4 local_38;
  undefined4 local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  uVar2 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_int32_cached_byte_size_);
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < (int)uVar2) {
    this_00 = _internal_repeated_int32(this);
    local_40 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    local_34 = 0x800;
    local_38 = 2;
    local_30 = stream;
    if (stream->end_ <= local_40) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_28 = local_40;
    for (local_1c = 0x4002; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *local_28 = (byte)local_1c | 0x80;
      local_28 = local_28 + 1;
    }
    *local_28 = (byte)local_1c;
    local_18 = (EpsCopyOutputStream *)(local_28 + 1);
    for (local_c = uVar2; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_b0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_28 = local_28 + 1;
    local_18 = local_b0;
    piVar5 = google::protobuf::RepeatedField<int>::data(this_00);
    iVar3 = google::protobuf::RepeatedField<int>::size(this_00);
    end = piVar5;
    do {
      local_88 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_b0);
      piVar6 = end + 1;
      for (local_80 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
          0x7f < local_80; local_80 = local_80 >> 7) {
        *local_88 = (byte)local_80 | 0x80;
        local_88 = local_88 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_88 + 1);
      *local_88 = (byte)local_80;
      end = piVar6;
      local_b0 = stream_local;
    } while (piVar6 < piVar5 + iVar3);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar3 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar3,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL PackedInt32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const PackedInt32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.PackedInt32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 2048 [features = {
  {
    int byte_size = this_._impl_._repeated_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2048, this_._internal_repeated_int32(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.PackedInt32)
  return target;
}